

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndFrame(void)

{
  bool bVar1;
  ImGuiWindow *window_00;
  bool bVar2;
  ImGuiWindow **ppIVar3;
  float fVar4;
  byte local_35;
  byte local_34;
  ImGuiWindow *window;
  int i;
  bool is_elapsed;
  bool is_delivered;
  ImVec2 local_18;
  ImGuiContext *local_10;
  ImGuiContext *g;
  
  local_10 = GImGui;
  if ((GImGui->Initialized & 1U) == 0) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1187,"void ImGui::EndFrame()");
  }
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    if ((GImGui->WithinFrameScope & 1U) == 0) {
      __assert_fail("g.WithinFrameScope && \"Forgot to call ImGui::NewFrame()?\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x118c,"void ImGui::EndFrame()");
    }
    CallContextHooks(GImGui,ImGuiContextHookType_EndFramePre);
    ErrorCheckEndFrameSanityChecks();
    bVar1 = false;
    if ((local_10->PlatformIO).Platform_SetImeInputPos != (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0
       ) {
      fVar4 = (local_10->PlatformImeLastPos).x;
      bVar1 = true;
      if ((fVar4 != 3.4028235e+38) || (NAN(fVar4))) {
        local_18 = operator-(&local_10->PlatformImePos,&local_10->PlatformImeLastPos);
        fVar4 = ImLengthSqr(&local_18);
        bVar1 = 0.0001 < fVar4;
      }
    }
    if (((bVar1) && (local_10->PlatformImePosViewport != (ImGuiViewportP *)0x0)) &&
       ((local_10->PlatformImePosViewport->PlatformWindowCreated & 1U) != 0)) {
      (*(local_10->PlatformIO).Platform_SetImeInputPos)
                (&local_10->PlatformImePosViewport->super_ImGuiViewport,local_10->PlatformImePos);
      local_10->PlatformImeLastPos = local_10->PlatformImePos;
      local_10->PlatformImePosViewport = (ImGuiViewportP *)0x0;
    }
    local_10->WithinFrameScopeWithImplicitWindow = false;
    if ((local_10->CurrentWindow != (ImGuiWindow *)0x0) &&
       ((local_10->CurrentWindow->WriteAccessed & 1U) == 0)) {
      local_10->CurrentWindow->Active = false;
    }
    End();
    EndFrameDrawDimmedBackgrounds();
    NavEndFrame();
    SetCurrentViewport((ImGuiWindow *)0x0,(ImGuiViewportP *)0x0);
    if ((local_10->DragDropActive & 1U) != 0) {
      bVar1 = (local_10->DragDropPayload).Delivery;
      local_34 = 0;
      if ((local_10->DragDropPayload).DataFrameCount + 1 < local_10->FrameCount) {
        local_35 = 1;
        if ((local_10->DragDropSourceFlags & 0x20U) == 0) {
          bVar2 = IsMouseDown(local_10->DragDropMouseButton);
          local_35 = bVar2 ^ 0xff;
        }
        local_34 = local_35;
      }
      if (((bVar1 & 1U) != 0) || ((local_34 & 1) != 0)) {
        ClearDragDrop();
      }
    }
    if ((((local_10->DragDropActive & 1U) != 0) &&
        (local_10->DragDropSourceFrameCount < local_10->FrameCount)) &&
       ((local_10->DragDropSourceFlags & 1U) == 0)) {
      local_10->DragDropWithinSource = true;
      SetTooltip("...");
      local_10->DragDropWithinSource = false;
    }
    local_10->WithinFrameScope = false;
    local_10->FrameCountEnded = local_10->FrameCount;
    UpdateMouseMovingWindowEndFrame();
    UpdateViewportsEndFrame();
    ImVector<ImGuiWindow_*>::resize(&local_10->WindowsTempSortBuffer,0);
    ImVector<ImGuiWindow_*>::reserve(&local_10->WindowsTempSortBuffer,(local_10->Windows).Size);
    for (window._0_4_ = 0; (int)window != (local_10->Windows).Size; window._0_4_ = (int)window + 1)
    {
      ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&local_10->Windows,(int)window);
      window_00 = *ppIVar3;
      if (((window_00->Active & 1U) == 0) || ((window_00->Flags & 0x1000000U) == 0)) {
        AddWindowToSortBuffer(&local_10->WindowsTempSortBuffer,window_00);
      }
    }
    if ((local_10->Windows).Size != (local_10->WindowsTempSortBuffer).Size) {
      __assert_fail("g.Windows.Size == g.WindowsTempSortBuffer.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x11d1,"void ImGui::EndFrame()");
    }
    ImVector<ImGuiWindow_*>::swap(&local_10->Windows,&local_10->WindowsTempSortBuffer);
    (local_10->IO).MetricsActiveWindows = local_10->WindowsActiveCount;
    ((local_10->IO).Fonts)->Locked = false;
    (local_10->IO).MouseWheelH = 0.0;
    (local_10->IO).MouseWheel = 0.0;
    ImVector<unsigned_short>::resize(&(local_10->IO).InputQueueCharacters,0);
    memset((local_10->IO).NavInputs,0,0x54);
    CallContextHooks(local_10,ImGuiContextHookType_EndFramePost);
  }
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    CallContextHooks(&g, ImGuiContextHookType_EndFramePre);

    ErrorCheckEndFrameSanityChecks();

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.PlatformIO.Platform_SetImeInputPos && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImePos - g.PlatformImeLastPos) > 0.0001f))
        if (g.PlatformImePosViewport && g.PlatformImePosViewport->PlatformWindowCreated)
        {
            g.PlatformIO.Platform_SetImeInputPos(g.PlatformImePosViewport, g.PlatformImePos);
            g.PlatformImeLastPos = g.PlatformImePos;
            g.PlatformImePosViewport = NULL;
        }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Draw modal whitening background on _other_ viewports than the one the modal is one
    EndFrameDrawDimmedBackgrounds();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    SetCurrentViewport(NULL, NULL);

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Update user-facing viewport list (g.Viewports -> g.PlatformIO.Viewports after filtering out some)
    UpdateViewportsEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    CallContextHooks(&g, ImGuiContextHookType_EndFramePost);
}